

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O0

GMM_SURFACESTATE_FORMAT
GmmGetSurfaceStateFormat(GMM_RESOURCE_FORMAT Format,GMM_LIB_CONTEXT *pGmmLibContext)

{
  GMM_PLATFORM_INFO *pGVar1;
  GMM_SURFACESTATE_FORMAT local_1c;
  GMM_LIB_CONTEXT *pGmmLibContext_local;
  GMM_RESOURCE_FORMAT Format_local;
  
  if (((int)Format < 1) || (0x180 < (int)Format)) {
    local_1c = GMM_SURFACESTATE_FORMAT_INVALID;
  }
  else {
    pGVar1 = GmmLib::Context::GetPlatformInfo(pGmmLibContext);
    local_1c = pGVar1->FormatTable[Format].SurfaceStateFormat;
  }
  return local_1c;
}

Assistant:

GMM_SURFACESTATE_FORMAT GMM_STDCALL GmmGetSurfaceStateFormat(GMM_RESOURCE_FORMAT Format, GMM_LIB_CONTEXT *pGmmLibContext)
{
    return ((Format > GMM_FORMAT_INVALID) &&
            (Format < GMM_RESOURCE_FORMATS)) ?
           pGmmLibContext->GetPlatformInfo().FormatTable[Format].SurfaceStateFormat :
           GMM_SURFACESTATE_FORMAT_INVALID;
}